

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O2

void __thiscall SpanList::popFront(SpanList *this)

{
  Span *pSVar1;
  Span *pSVar2;
  Span *tmp;
  Span *pSVar3;
  
  pSVar1 = this->list;
  pSVar3 = pSVar1->next;
  if (pSVar3 == pSVar1) {
    pSVar3 = (Span *)0x0;
  }
  else {
    pSVar2 = pSVar1->prev;
    pSVar2->next = pSVar3;
    pSVar1->next->prev = pSVar2;
  }
  this->list = pSVar3;
  return;
}

Assistant:

void SpanList::popFront() {
  if (list->next == list) { // 如果链表只有一个元素, 那么直接让它指向空指针
    list = nullptr;
  } else {
    auto tmp = list->next;
    list->prev->next = list->next;
    list->next->prev = list->prev;

    list = tmp; // 非常重要!
  }
}